

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O2

void PoolAllocPages(MemoryPool *pool,size_t number)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  undefined4 extraout_var;
  AddressRange *pAVar7;
  ulong uVar8;
  AddressRange *pAVar9;
  undefined1 *puVar10;
  Page *pacVar11;
  long lVar12;
  size_t i;
  void *pvVar13;
  ulong uVar14;
  Page *addr;
  ulong size;
  Page *page;
  size_t first;
  void *pvVar15;
  size_t size_00;
  ulong uVar16;
  Page *pacVar17;
  ulong __denom;
  bool bVar18;
  undefined1 auVar19 [16];
  lldiv_t lVar20;
  bool local_51;
  
  pvVar5 = pthread_getspecific(tsdKey);
  __denom = systemPageSize >> 0xc;
  uVar16 = 1;
  if (number == 1) {
    local_51 = 1 < pool->generation;
    size = 1;
LAB_0010621d:
    if (((allocGranularity >> ((byte)shiftPage & 0x3f)) + 0xff & size) != 0) {
      pvVar6 = pthread_getspecific(tsdKey);
      iVar4 = *(int *)((long)pvVar6 + 0x460);
      *(int *)((long)pvVar6 + 0x460) = iVar4 + 1;
      if (iVar4 == 0) {
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
        pvVar6 = (void *)CONCAT44(extraout_var,iVar4);
      }
      pAVar7 = (AddressRange *)&ranges;
      do {
        do {
          pAVar9 = pAVar7->next;
          if (pAVar9 == (AddressRange *)0x0) {
            uVar8 = (long)pvVar6 * 2;
            if (0x7fff < uVar8) {
              uVar8 = 0x8000;
            }
            size_00 = 0x100;
            if (ranges != (AddressRange *)0x0) {
              size_00 = uVar8;
            }
            pvVar6 = PlatReserveRange(size_00,0);
            if (pvVar6 != (void *)0x0) {
              uVar8 = size_00 + 7 >> 3;
              pAVar9 = (AddressRange *)malloc(uVar8 + size_00 + 0x28);
              pAVar7->next = pAVar9;
              pAVar9->base = pvVar6;
              pAVar9->next = (AddressRange *)0x0;
              pAVar9->size = size_00;
              pAVar9->free = size_00;
              pAVar9->first = 0;
              pvVar13 = (void *)0x0;
              memset(pAVar9 + 1,0,uVar8 + size_00);
              goto LAB_0010643f;
            }
            addr = (Page *)0x0;
            Col_Error(COL_FATAL,ColibriDomain,2,"Address range reservation failed");
            goto LAB_001064f6;
          }
          pvVar6 = (void *)pAVar9->size;
          pAVar7 = pAVar9;
        } while (pAVar9->free < size);
        pvVar13 = (void *)pAVar9->first;
        uVar8 = size;
        pvVar15 = (void *)0xffffffffffffffff;
        if ((size == 1) && (*(char *)((long)&pAVar9[1].next + (long)pvVar13) == '\0'))
        goto LAB_0010643b;
        for (; pvVar13 < pvVar6; pvVar13 = (void *)((long)pvVar13 + 1)) {
          uVar14 = size;
          if (*(char *)((long)&pAVar9[1].next + (long)pvVar13) == '\0') {
            if (uVar8 == size) {
              pvVar15 = pvVar13;
            }
            uVar14 = uVar8 - 1;
            if (uVar8 - 1 == 0) {
              pvVar13 = pvVar15;
              if (pvVar15 != (void *)0xffffffffffffffff) goto LAB_0010643b;
              break;
            }
          }
          uVar8 = uVar14;
        }
      } while( true );
    }
  }
  else {
    lVar20 = lldiv(number,__denom);
    size = (lVar20.quot + 1) - (ulong)(lVar20.rem == 0);
    __denom = (__denom * size - number) + 1;
    if (0x7f < size) {
      __denom = uVar16;
    }
    local_51 = 1 < pool->generation;
    if (size < 0x81) goto LAB_0010621d;
  }
  addr = (Page *)PlatReserveRange(size,1);
  if (addr == (Page *)0x0) {
    addr = (Page *)0x0;
    Col_Error(COL_FATAL,ColibriDomain,2,"Address range allocation failed");
    goto LAB_0010651b;
  }
  pvVar6 = pthread_getspecific(tsdKey);
  iVar4 = *(int *)((long)pvVar6 + 0x460);
  *(int *)((long)pvVar6 + 0x460) = iVar4 + 1;
  if (iVar4 == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
  }
  pAVar7 = (AddressRange *)malloc(0x29);
  pAVar7->next = dedicatedRanges;
  pAVar7->base = addr;
  pAVar7->size = size;
  pAVar7->free = 0;
  pAVar7->first = size;
  *(bool *)&pAVar7[1].next = local_51;
  dedicatedRanges = pAVar7;
  pvVar6 = pthread_getspecific(tsdKey);
  piVar1 = (int *)((long)pvVar6 + 0x460);
  *piVar1 = *piVar1 + -1;
  iVar4 = *piVar1;
  goto joined_r0x0010650d;
LAB_0010643b:
  pvVar6 = pAVar9->base;
LAB_0010643f:
  addr = (Page *)(((long)pvVar13 << ((byte)shiftPage & 0x3f)) + (long)pvVar6);
  iVar4 = PlatAllocPages(addr,size);
  if (iVar4 == 0) {
    Col_Error(COL_FATAL,ColibriDomain,2,"Page allocation failed");
  }
  else {
    puVar10 = (undefined1 *)((long)&pAVar9[1].next + 1) + (long)pvVar13;
    *(char *)&((AddressRange *)(puVar10 + -1))->next = -(char)size;
    for (; uVar16 < size; uVar16 = uVar16 + 1) {
      *puVar10 = (char)uVar16;
      puVar10 = puVar10 + 1;
    }
    bVar3 = '\x01' << ((byte)pvVar13 & 7);
    if (local_51 == false) {
      pbVar2 = (byte *)((long)&pAVar9[1].next + ((ulong)pvVar13 >> 3) + pAVar9->size);
      *pbVar2 = *pbVar2 & ~bVar3;
    }
    else {
      pbVar2 = (byte *)((long)&pAVar9[1].next + ((ulong)pvVar13 >> 3) + pAVar9->size);
      *pbVar2 = *pbVar2 | bVar3;
    }
    pAVar9->free = pAVar9->free - size;
    if (pvVar13 == (void *)pAVar9->first) {
      pAVar9->first = (long)pvVar13 + size;
    }
  }
LAB_001064f6:
  pvVar6 = pthread_getspecific(tsdKey);
  piVar1 = (int *)((long)pvVar6 + 0x460);
  *piVar1 = *piVar1 + -1;
  iVar4 = *piVar1;
joined_r0x0010650d:
  if (iVar4 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&mutexRange);
  }
LAB_0010651b:
  if (pool->pages == (Page *)0x0) {
    pool->pages = addr;
    for (lVar12 = 0; lVar12 != 0x7f; lVar12 = lVar12 + 1) {
      pool->lastFreeCell[lVar12] = (Cell *)addr;
    }
  }
  auVar19._8_4_ = (int)__denom;
  auVar19._0_8_ = __denom;
  auVar19._12_4_ = (int)(__denom >> 0x20);
  pool->nbPages = __denom + pool->nbPages;
  pool->nbAlloc = auVar19._8_8_ + pool->nbAlloc;
  pool->nbSetCells = pool->nbSetCells + __denom;
  pacVar11 = pool->lastPage;
  page = addr;
  pacVar17 = addr;
  while (bVar18 = __denom != 0, __denom = __denom - 1, bVar18) {
    if (pacVar11 != (Page *)0x0) {
      *(ulong *)*pacVar11 = CONCAT71((int7)((ulong)pacVar17 >> 8),(*pacVar11)[0]);
    }
    (*page)[0] = (byte)pool->generation & 0xf;
    *(undefined8 *)(*page + 8) = *(undefined8 *)((long)pvVar5 + 8);
    ClearAllCells(page);
    pacVar17 = pacVar17 + 1;
    pacVar11 = page;
    page = page + 1;
  }
  pool->lastPage = pacVar11;
  (*addr)[0] = (*addr)[0] | 0x10;
  *(ulong *)*pacVar11 = (ulong)(byte)(*pacVar11)[0] | 0x20;
  return;
}

Assistant:

void
PoolAllocPages(
    MemoryPool *pool,   /*!< Pool to allocate pages into. */
    size_t number)      /*!< Number of pages to allocate. */
{
    ThreadData *data = PlatGetThreadData();
    Page *base, *page, *prev;
    const size_t nbPagesPerSysPage = systemPageSize/PAGE_SIZE;
    size_t nbSysPages, nbPages;
    size_t i;

    if (number == 1) {
        /*
         * Regular case: allocate one physical page divided into equally sized
         * logical pages.
         */

        nbSysPages = 1;
        nbPages = nbPagesPerSysPage;
    } else {
        /*
         * Allocate enough physical pages for the given number of logical pages.
         */

        lldiv_t d = lldiv(number, nbPagesPerSysPage);
        nbSysPages = d.quot + (d.rem?1:0);
        if (nbSysPages >= LARGE_PAGE_SIZE) {
            /*
             * Pages are in their own dedicated range.
             */

            nbPages = 1;
        } else {
            nbPages = (nbSysPages * nbPagesPerSysPage) - number + 1;
        }
    }

    /*
     * Allocate system pages. Make sure to mark pages as written for older
     * generations for proper parent tracking.
     */

    base = (Page *) SysPageAlloc(nbSysPages, (pool->generation >= 2));

    if (!pool->pages) {
        pool->pages = base;
        for (i = 0; i < AVAILABLE_CELLS; i++) {
            pool->lastFreeCell[i] = PAGE_CELL(base, 0);
        }
    }

    pool->nbPages += nbPages;
    pool->nbAlloc += nbPages;
    pool->nbSetCells += RESERVED_CELLS*nbPages;

    /*
     * Initialize pages.
     */

    prev = pool->lastPage;
    for (i = 0, page = base; i < nbPages; i++, page++) {
        /*
         * Pages are linked in order.
         */

        if (prev) {
            PAGE_SET_NEXT(prev, page);
        }
        prev = page;

        PAGE_SET_GENERATION(page, pool->generation);
        PAGE_CLEAR_FLAG(page, PAGE_FLAGS_MASK);
        PAGE_GROUPDATA(page) = data->groupData;

        /* Initialize bit mask for allocated cells. */
        ClearAllCells(page);
    }
    pool->lastPage = prev;
    PAGE_SET_FLAG(base, PAGE_FLAG_FIRST);
    PAGE_SET_NEXT(prev, NULL);
    PAGE_SET_FLAG(prev, PAGE_FLAG_LAST);
}